

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,value_type *v)

{
  integer_type i;
  string_type *__str;
  string_format_info *fmt;
  array_type *a;
  array_format_info *fmt_00;
  integer_type *piVar1;
  integer_format_info *fmt_01;
  floating_type *pfVar2;
  floating_format_info *fmt_02;
  local_date_type *d;
  local_date_format_info *plVar3;
  boolean_type *b;
  boolean_format_info *pbVar4;
  offset_datetime_type *odt;
  offset_datetime_format_info *fmt_03;
  local_datetime_type *dt;
  local_datetime_format_info *fmt_04;
  table_format_info *ptVar5;
  table_type *t;
  local_time_type *t_00;
  local_time_format_info *fmt_05;
  serialization_error *this_00;
  source_location local_240;
  floating_type local_1c8;
  string_type local_1c0;
  string_type local_1a0;
  string local_180;
  string local_160;
  string local_140;
  source_location local_120;
  source_location local_a8;
  
  switch(v->type_) {
  case empty:
    if ((this->spec_).ext_null_value == true) {
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<5ul>(__return_storage_ptr__,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x35fc7d,(char (*) [5])v);
      return __return_storage_ptr__;
    }
  default:
    this_00 = (serialization_error *)__cxa_allocate_exception(0xa0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,
               "[error] toml::serializer: toml::basic_value does not have any valid type.",
               (allocator<char> *)&local_240);
    source_location::source_location(&local_a8,&v->region_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"here",(allocator<char> *)&local_1c0);
    format_error<>(&local_140,&local_160,&local_a8,&local_180);
    source_location::source_location(&local_120,&v->region_);
    serialization_error::serialization_error(this_00,&local_140,&local_120);
    __cxa_throw(this_00,&serialization_error::typeinfo,serialization_error::~serialization_error);
  case boolean:
    b = basic_value<toml::type_config>::as_boolean(v);
    pbVar4 = basic_value<toml::type_config>::as_boolean_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,b,pbVar4,&local_240);
    break;
  case integer:
    piVar1 = basic_value<toml::type_config>::as_integer(v);
    i = *piVar1;
    fmt_01 = basic_value<toml::type_config>::as_integer_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,i,fmt_01,&local_240);
    break;
  case floating:
    pfVar2 = basic_value<toml::type_config>::as_floating(v);
    local_1c8 = *pfVar2;
    fmt_02 = basic_value<toml::type_config>::as_floating_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,local_1c8,fmt_02,&local_240);
    break;
  case string:
    __str = basic_value<toml::type_config>::as_string_abi_cxx11_(v);
    std::__cxx11::string::string
              ((string *)&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    fmt = basic_value<toml::type_config>::as_string_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()(__return_storage_ptr__,this,&local_1a0,fmt,&local_240);
    source_location::~source_location(&local_240);
    std::__cxx11::string::~string((string *)&local_1a0);
    return __return_storage_ptr__;
  case offset_datetime:
    odt = basic_value<toml::type_config>::as_offset_datetime(v);
    fmt_03 = basic_value<toml::type_config>::as_offset_datetime_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,odt,fmt_03,&local_240);
    break;
  case local_datetime:
    dt = basic_value<toml::type_config>::as_local_datetime(v);
    fmt_04 = basic_value<toml::type_config>::as_local_datetime_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,dt,fmt_04,&local_240);
    break;
  case local_date:
    d = basic_value<toml::type_config>::as_local_date(v);
    plVar3 = basic_value<toml::type_config>::as_local_date_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,d,plVar3,&local_240);
    break;
  case local_time:
    t_00 = basic_value<toml::type_config>::as_local_time(v);
    fmt_05 = basic_value<toml::type_config>::as_local_time_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,t_00,fmt_05,&local_240);
    break;
  case array:
    a = basic_value<toml::type_config>::as_array(v);
    fmt_00 = basic_value<toml::type_config>::as_array_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,a,fmt_00,&v->comments_,&local_240);
    break;
  case table:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ptVar5 = basic_value<toml::type_config>::as_table_fmt(v);
      format_comments_abi_cxx11_((string_type *)&local_240,this,&v->comments_,ptVar5->indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      if (__return_storage_ptr__->_M_string_length != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,'\n');
      }
    }
    t = basic_value<toml::type_config>::as_table_abi_cxx11_(v);
    ptVar5 = basic_value<toml::type_config>::as_table_fmt(v);
    source_location::source_location(&local_240,&v->region_);
    operator()(&local_1c0,this,t,ptVar5,&v->comments_,&local_240);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  source_location::~source_location(&local_240);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const value_type& v)
    {
        switch(v.type())
        {
            case value_t::boolean        : {return (*this)(v.as_boolean        (), v.as_boolean_fmt        (), v.location());}
            case value_t::integer        : {return (*this)(v.as_integer        (), v.as_integer_fmt        (), v.location());}
            case value_t::floating       : {return (*this)(v.as_floating       (), v.as_floating_fmt       (), v.location());}
            case value_t::string         : {return (*this)(v.as_string         (), v.as_string_fmt         (), v.location());}
            case value_t::offset_datetime: {return (*this)(v.as_offset_datetime(), v.as_offset_datetime_fmt(), v.location());}
            case value_t::local_datetime : {return (*this)(v.as_local_datetime (), v.as_local_datetime_fmt (), v.location());}
            case value_t::local_date     : {return (*this)(v.as_local_date     (), v.as_local_date_fmt     (), v.location());}
            case value_t::local_time     : {return (*this)(v.as_local_time     (), v.as_local_time_fmt     (), v.location());}
            case value_t::array          :
            {
                return (*this)(v.as_array(), v.as_array_fmt(), v.comments(), v.location());
            }
            case value_t::table          :
            {
                string_type retval;
                if(this->keys_.empty()) // it might be the root table. emit comments here.
                {
                    retval += format_comments(v.comments(), v.as_table_fmt().indent_type);
                }
                if( ! retval.empty()) // we have comment.
                {
                    retval += char_type('\n');
                }

                retval += (*this)(v.as_table(), v.as_table_fmt(), v.comments(), v.location());
                return retval;
            }
            case value_t::empty:
            {
                if(this->spec_.ext_null_value)
                {
                    return string_conv<string_type>("null");
                }
                break;
            }
            default:
            {
                break;
            }
        }
        throw serialization_error(format_error(
            "[error] toml::serializer: toml::basic_value "
            "does not have any valid type.", v.location(), "here"), v.location());
    }